

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * randomMessageGen_abi_cxx11_(void)

{
  uint uVar1;
  result_type rVar2;
  string *in_RDI;
  uniform_int_distribution<int> dis;
  random_device rd;
  mt19937 gen;
  allocator<char> local_2729;
  param_type local_2728;
  random_device local_2720;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_1398;
  
  std::random_device::random_device(&local_2720);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_1398,(ulong)uVar1);
  local_2728._M_a = 1;
  local_2728._M_b = 8;
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_2728,&local_1398);
  switch(rVar2) {
  case 1:
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Riddikulus",&local_2729);
    break;
  case 2:
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Crucio",&local_2729);
    break;
  case 3:
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Lumos",&local_2729);
    break;
  case 4:
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Nox",&local_2729);
    break;
  case 5:
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Patronus",&local_2729);
    break;
  case 6:
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Imperio",&local_2729);
    break;
  case 7:
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Expelliarmus",&local_2729);
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,"Pulvis et umbra sumus",&local_2729);
  }
  std::random_device::~random_device(&local_2720);
  return in_RDI;
}

Assistant:

string randomMessageGen()
{
    random_device rd;
    mt19937 gen(rd());
    const int AVALIVABLE_MSG = 8;
    uniform_int_distribution<> dis(1, AVALIVABLE_MSG);
    switch (dis(gen)) {
      case 1:
         return "Riddikulus";
      case 2:
          return "Crucio";
      case 3:
          return "Lumos";
      case 4:
          return "Nox";
      case 5:
          return "Patronus";
      case 6:
         return "Imperio";
      case 7:
        return "Expelliarmus";
      default:
         return "Pulvis et umbra sumus";
    }
}